

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisDecoderDecodeOperands
          (ZydisDecoder *decoder,ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count)

{
  ZyanU8 local_38;
  ZyanU8 operand_count_local;
  ZydisDecodedOperand *operands_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  ZydisDecoder *decoder_local;
  
  if (((((decoder == (ZydisDecoder *)0x0) || (context == (ZydisDecoderContext *)0x0)) ||
       (context->definition == (void *)0x0)) ||
      ((instruction == (ZydisDecodedInstruction *)0x0 ||
       ((operand_count != '\0' && (operands == (ZydisDecodedOperand *)0x0)))))) ||
     (10 < operand_count)) {
    decoder_local._4_4_ = 0x80100004;
  }
  else if ((decoder->decoder_mode & 1) == 0) {
    local_38 = operand_count;
    if (instruction->operand_count <= operand_count) {
      local_38 = instruction->operand_count;
    }
    if (local_38 == '\0') {
      decoder_local._4_4_ = 0x100000;
    }
    else {
      decoder_local._4_4_ = ZydisDecodeOperands(decoder,context,instruction,operands,local_38);
    }
  }
  else {
    decoder_local._4_4_ = 0x8010000d;
  }
  return decoder_local._4_4_;
}

Assistant:

ZyanStatus ZydisDecoderDecodeOperands(const ZydisDecoder* decoder,
    const ZydisDecoderContext* context, const ZydisDecodedInstruction* instruction,
    ZydisDecodedOperand* operands, ZyanU8 operand_count)
{
#ifdef ZYDIS_MINIMAL_MODE

    ZYAN_UNUSED(decoder);
    ZYAN_UNUSED(context);
    ZYAN_UNUSED(instruction);
    ZYAN_UNUSED(operands);
    ZYAN_UNUSED(operand_count);

    return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code

#else

    if (!decoder || !context || !context->definition || !instruction ||
        (operand_count && !operands) || (operand_count > ZYDIS_MAX_OPERAND_COUNT))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL))
    {
        return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code
    }

    operand_count = ZYAN_MIN(operand_count, instruction->operand_count);
    if (!operand_count)
    {
        return ZYAN_STATUS_SUCCESS;
    }

    return ZydisDecodeOperands(decoder, context, instruction, operands, operand_count);

#endif
}